

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VaultClient.cpp
# Opt level: O3

Url * __thiscall
Vault::Client::getUrl(Url *__return_storage_ptr__,Client *this,string *base,Path *path)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  long *plVar3;
  size_type *psVar4;
  char *string;
  string local_c8;
  string local_a8;
  string local_88;
  string local_68;
  string local_48;
  
  string = "http://";
  if (this->tls_ != false) {
    string = "https://";
  }
  Vault::operator+(&local_48,string,&this->host_);
  plVar3 = (long *)std::__cxx11::string::append((char *)&local_48);
  psVar4 = (size_type *)(plVar3 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar3 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar4) {
    local_c8.field_2._M_allocated_capacity = *psVar4;
    local_c8.field_2._8_8_ = plVar3[3];
    local_c8._M_dataplus._M_p = (pointer)&local_c8.field_2;
  }
  else {
    local_c8.field_2._M_allocated_capacity = *psVar4;
    local_c8._M_dataplus._M_p = (pointer)*plVar3;
  }
  local_c8._M_string_length = plVar3[1];
  *plVar3 = (long)psVar4;
  plVar3[1] = 0;
  *(undefined1 *)(plVar3 + 2) = 0;
  Vault::operator+(&local_68,&local_c8,&this->port_);
  plVar3 = (long *)std::__cxx11::string::_M_append
                             ((char *)&local_68,(ulong)(base->_M_dataplus)._M_p);
  psVar4 = (size_type *)(plVar3 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar3 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar4) {
    local_a8.field_2._M_allocated_capacity = *psVar4;
    local_a8.field_2._8_8_ = plVar3[3];
    local_a8._M_dataplus._M_p = (pointer)&local_a8.field_2;
  }
  else {
    local_a8.field_2._M_allocated_capacity = *psVar4;
    local_a8._M_dataplus._M_p = (pointer)*plVar3;
  }
  local_a8._M_string_length = plVar3[1];
  *plVar3 = (long)psVar4;
  plVar3[1] = 0;
  *(undefined1 *)(plVar3 + 2) = 0;
  Vault::operator+(&local_88,&local_a8,path);
  paVar1 = &(__return_storage_ptr__->value_).field_2;
  (__return_storage_ptr__->value_)._M_dataplus._M_p = (pointer)paVar1;
  paVar2 = &local_88.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_88._M_dataplus._M_p == paVar2) {
    paVar1->_M_allocated_capacity =
         CONCAT71(local_88.field_2._M_allocated_capacity._1_7_,local_88.field_2._M_local_buf[0]);
    *(undefined8 *)((long)&(__return_storage_ptr__->value_).field_2 + 8) = local_88.field_2._8_8_;
  }
  else {
    (__return_storage_ptr__->value_)._M_dataplus._M_p = local_88._M_dataplus._M_p;
    (__return_storage_ptr__->value_).field_2._M_allocated_capacity =
         CONCAT71(local_88.field_2._M_allocated_capacity._1_7_,local_88.field_2._M_local_buf[0]);
  }
  (__return_storage_ptr__->value_)._M_string_length = local_88._M_string_length;
  local_88._M_string_length = 0;
  local_88.field_2._M_local_buf[0] = '\0';
  local_88._M_dataplus._M_p = (pointer)paVar2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
    operator_delete(local_a8._M_dataplus._M_p,local_a8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != &local_68.field_2) {
    operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
    operator_delete(local_c8._M_dataplus._M_p,local_c8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != &local_48.field_2) {
    operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

Vault::Url Vault::Client::getUrl(const std::string &base,
                                 const Vault::Path &path) const {
  return Vault::Url{(tls_ ? "https://" : "http://") + host_ + ":" + port_ +
                    base + path};
}